

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outputtype.cpp
# Opt level: O0

string * FormatOutputType_abi_cxx11_(OutputType type)

{
  undefined4 in_EDI;
  long in_FS_OFFSET;
  string *local_10;
  
  switch(in_EDI) {
  case 0:
    local_10 = &OUTPUT_TYPE_STRING_LEGACY_abi_cxx11_;
    break;
  case 1:
    local_10 = &OUTPUT_TYPE_STRING_P2SH_SEGWIT_abi_cxx11_;
    break;
  case 2:
    local_10 = &OUTPUT_TYPE_STRING_BECH32_abi_cxx11_;
    break;
  case 3:
    local_10 = &OUTPUT_TYPE_STRING_BECH32M_abi_cxx11_;
    break;
  case 4:
    local_10 = &OUTPUT_TYPE_STRING_UNKNOWN_abi_cxx11_;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/outputtype.cpp"
                  ,0x2f,"const std::string &FormatOutputType(OutputType)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

const std::string& FormatOutputType(OutputType type)
{
    switch (type) {
    case OutputType::LEGACY: return OUTPUT_TYPE_STRING_LEGACY;
    case OutputType::P2SH_SEGWIT: return OUTPUT_TYPE_STRING_P2SH_SEGWIT;
    case OutputType::BECH32: return OUTPUT_TYPE_STRING_BECH32;
    case OutputType::BECH32M: return OUTPUT_TYPE_STRING_BECH32M;
    case OutputType::UNKNOWN: return OUTPUT_TYPE_STRING_UNKNOWN;
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}